

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O2

ppointer p_tree_lookup(PTree *tree,pconstpointer key)

{
  pint pVar1;
  PTree *pPVar2;
  
  pPVar2 = tree;
  if (tree != (PTree *)0x0) {
    while (pPVar2 = (PTree *)pPVar2->root, pPVar2 != (PTree *)0x0) {
      pVar1 = (*tree->compare_func)(key,pPVar2->remove_node_func,tree->data);
      if (-1 < pVar1) {
        if (pVar1 == 0) {
          return pPVar2->free_node_func;
        }
        pPVar2 = (PTree *)&pPVar2->insert_node_func;
      }
    }
  }
  return (ppointer)0x0;
}

Assistant:

P_LIB_API ppointer
p_tree_lookup (PTree		*tree,
	       pconstpointer	key)
{
	PTreeBaseNode	*cur_node;
	pint		cmp_result;

	if (P_UNLIKELY (tree == NULL))
		return NULL;

	cur_node = tree->root;

	while (cur_node != NULL) {
		cmp_result = tree->compare_func (key, cur_node->key, tree->data);

		if (cmp_result < 0)
			cur_node = cur_node->left;
		else if (cmp_result > 0)
			cur_node = cur_node->right;
		else
			return cur_node->value;
	}

	return NULL;
}